

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::equal_to<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>
::AssertHashEqConsistent<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::equal_to<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>
           *this,pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *key)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 *puVar3;
  bool bVar4;
  ushort uVar5;
  uintptr_t v;
  uint64_t uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *key_1;
  pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar13;
  undefined1 (*pauVar14) [16];
  uint uVar15;
  
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
              *)this);
  if (1 < *(ulong *)(this + 8)) {
    uVar8 = ((ulong)key->first ^ 0x572bb8) * -0x234dd359734ecb13;
    uVar9 = ((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18
              | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18
              | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38) ^ (ulong)key->first) * -0x234dd359734ecb13
    ;
    uVar8 = (key->second)._M_string_length;
    uVar6 = hash_internal::MixingHashState::CombineContiguousImpl
                      (uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                       (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                       (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                       (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38,(key->second)._M_dataplus._M_p,uVar8
                      );
    uVar9 = *(ulong *)this;
    if (uVar9 < 0x11) {
      uVar8 = uVar6 ^ uVar8;
      pauVar14 = *(undefined1 (**) [16])(this + 0x10);
      lVar7 = *(long *)(this + 0x18);
      if (uVar9 < 0xf) {
        if (8 < uVar9) {
          __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x78b,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                       );
        }
        uVar9 = *(ulong *)(*pauVar14 + uVar9) & 0x8080808080808080;
        if (uVar9 != 0x8080808080808080) {
          uVar9 = uVar9 ^ 0x8080808080808080;
          do {
            uVar10 = 0;
            if (uVar9 != 0) {
              for (; (uVar9 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
              }
            }
            ppVar13 = (pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((ulong)(((uint)(uVar10 >> 3) & 0x1fffffff) * 0x30) + lVar7 + -0x30);
            bVar4 = std::
                    equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator()((equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)this,ppVar13,key);
            if (bVar4) {
              uVar10 = ((ulong)ppVar13->first ^ 0x572bb8) * -0x234dd359734ecb13;
              uVar11 = ((uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                         (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                         (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                         (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38) ^ (ulong)ppVar13->first) *
                       -0x234dd359734ecb13;
              uVar10 = (ppVar13->second)._M_string_length;
              uVar6 = hash_internal::MixingHashState::CombineContiguousImpl
                                (uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                                 (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                                 (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                                 (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38,
                                 (ppVar13->second)._M_dataplus._M_p,uVar10);
              if (uVar8 != (uVar6 ^ uVar10)) {
LAB_00207d6a:
                __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0xfbf,
                              "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, std::equal_to<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, std::allocator<std::pair<const std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>>>::AssertHashEqConsistent(const std::pair<const google::protobuf::Message *, std::basic_string<char>> &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, Alloc = std::allocator<std::pair<const std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>>]"
                             );
              }
            }
            uVar9 = uVar9 & uVar9 - 1;
          } while (uVar9 != 0);
        }
      }
      else if (1 < *(ulong *)(this + 8)) {
        uVar10 = *(ulong *)(this + 8) >> 1;
        uVar9 = uVar10;
        while( true ) {
          auVar1 = *pauVar14;
          uVar15 = (uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(byte)(auVar1[0xf] >> 7) << 0xf);
          if (uVar15 != 0xffff) {
            uVar15 = ~uVar15;
            do {
              uVar2 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
                }
              }
              if ((char)(*pauVar14)[uVar2] < '\0') {
                __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x79d,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
              ppVar13 = (pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)((ulong)(uVar2 * 0x30) + lVar7);
              bVar4 = std::
                      equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator()((equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)this,ppVar13,key);
              if (bVar4) {
                uVar11 = ((ulong)ppVar13->first ^ (ulong)&hash_internal::MixingHashState::kSeed) *
                         -0x234dd359734ecb13;
                uVar12 = ((uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                           (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                           (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                           (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) ^ (ulong)ppVar13->first) *
                         -0x234dd359734ecb13;
                uVar11 = (ppVar13->second)._M_string_length;
                uVar6 = hash_internal::MixingHashState::CombineContiguousImpl
                                  (uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                                   (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8
                                   | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                                   (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38,
                                   (ppVar13->second)._M_dataplus._M_p,uVar11);
                if (uVar8 != (uVar6 ^ uVar11)) goto LAB_00207d6a;
              }
              uVar9 = uVar9 - 1;
              uVar5 = (ushort)(uVar15 - 1) & (ushort)uVar15;
              uVar15 = CONCAT22((short)(uVar15 - 1 >> 0x10),uVar5);
            } while (uVar5 != 0);
          }
          if (uVar9 == 0) break;
          lVar7 = lVar7 + 0x300;
          puVar3 = *pauVar14;
          pauVar14 = pauVar14 + 1;
          if (puVar3[0xf] == -1) {
            __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7a5,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
        }
        if (uVar10 < *(ulong *)(this + 8) >> 1) {
          __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7aa,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                       );
        }
      }
    }
  }
  return;
}

Assistant:

void AssertHashEqConsistent(const K& key) {
#ifdef NDEBUG
    return;
#endif
    // If the hash/eq functors are known to be consistent, then skip validation.
    if (std::is_same<hasher, absl::container_internal::StringHash>::value &&
        std::is_same<key_equal, absl::container_internal::StringEq>::value) {
      return;
    }
    if (std::is_scalar<key_type>::value &&
        std::is_same<hasher, absl::Hash<key_type>>::value &&
        std::is_same<key_equal, std::equal_to<key_type>>::value) {
      return;
    }
    if (empty()) return;

    const size_t hash_of_arg = hash_ref()(key);
    const auto assert_consistent = [&](const ctrl_t*, slot_type* slot) {
      const value_type& element = PolicyTraits::element(slot);
      const bool is_key_equal =
          PolicyTraits::apply(EqualElement<K>{key, eq_ref()}, element);
      if (!is_key_equal) return;

      const size_t hash_of_slot =
          PolicyTraits::apply(HashElement{hash_ref()}, element);
      ABSL_ATTRIBUTE_UNUSED const bool is_hash_equal =
          hash_of_arg == hash_of_slot;
      assert((!is_key_equal || is_hash_equal) &&
             "eq(k1, k2) must imply that hash(k1) == hash(k2). "
             "hash/eq functors are inconsistent.");
    };

    if (is_soo()) {
      assert_consistent(/*unused*/ nullptr, soo_slot());
      return;
    }
    // We only do validation for small tables so that it's constant time.
    if (capacity() > 16) return;
    IterateOverFullSlots(common(), slot_array(), assert_consistent);
  }